

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

ostream * wasm::operator<<(ostream *o,Literals *literals)

{
  ostream *o_00;
  ulong uVar1;
  long lVar2;
  Literal local_80;
  Literal local_68;
  Literal local_50;
  ostream *local_38;
  
  if (((long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
            super__Vector_impl_data._M_start) / 0x18 +
      (literals->super_SmallVector<wasm::Literal,_1UL>).usedFixed == 1) {
    Literal::Literal(&local_68,(literals->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems);
    operator<<(o,&local_68);
    Literal::~Literal(&local_68);
  }
  else {
    std::operator<<(o,'(');
    if (((long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_finish -
        (long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
              super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
              super__Vector_impl_data._M_start) / 0x18 +
        (literals->super_SmallVector<wasm::Literal,_1UL>).usedFixed != 0) {
      Literal::Literal(&local_50,(literals->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems);
      operator<<(o,&local_50);
      Literal::~Literal(&local_50);
    }
    lVar2 = 0;
    local_38 = o;
    for (uVar1 = 1;
        uVar1 < ((long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
                       super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
                      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x18 +
                (literals->super_SmallVector<wasm::Literal,_1UL>).usedFixed; uVar1 = uVar1 + 1) {
      o_00 = std::operator<<(local_38,", ");
      Literal::Literal(&local_80,
                       (Literal *)
                       ((long)&((literals->super_SmallVector<wasm::Literal,_1UL>).flexible.
                                super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                                _M_impl.super__Vector_impl_data._M_start)->field_0 + lVar2));
      operator<<(o_00,&local_80);
      Literal::~Literal(&local_80);
      lVar2 = lVar2 + 0x18;
    }
    o = std::operator<<(local_38,')');
  }
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, wasm::Literals literals) {
  if (literals.size() == 1) {
    return o << literals[0];
  } else {
    o << '(';
    if (literals.size() > 0) {
      o << literals[0];
    }
    for (size_t i = 1; i < literals.size(); ++i) {
      o << ", " << literals[i];
    }
    return o << ')';
  }
}